

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_xc_ksdt.c
# Opt level: O1

void lda_xc_ksdt_init(xc_func_type *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  double *pdVar19;
  double dVar20;
  double dVar21;
  void *__dest;
  long lVar22;
  long *plVar23;
  long lVar24;
  long extraout_RDX;
  long in_RSI;
  lda_xc_ksdt_params *__src;
  long *plVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double __x;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dStack_248;
  
  plVar25 = (long *)0x130;
  __dest = malloc(0x130);
  p->params = __dest;
  uVar18 = p->info->number;
  plVar23 = (long *)(ulong)uVar18;
  if (uVar18 == 0x241) {
    __src = &par_gdsmfb;
  }
  else if (uVar18 == 0x13e) {
    __src = &par_corrksdt;
  }
  else {
    if (uVar18 != 0x103) {
      lda_xc_ksdt_init_cold_1();
      if (in_RSI != 0) {
        lVar26 = 0;
        do {
          if ((int)plVar25[1] == 2) {
            lVar22 = (int)plVar25[9] * lVar26;
            dVar38 = *(double *)(extraout_RDX + lVar22 * 8) +
                     *(double *)(extraout_RDX + 8 + lVar22 * 8);
          }
          else {
            dVar38 = *(double *)(extraout_RDX + (int)plVar25[9] * lVar26 * 8);
          }
          dVar33 = (double)plVar25[0x30];
          if (dVar33 <= dVar38) {
            dVar38 = *(double *)(extraout_RDX + (int)plVar25[9] * lVar26 * 8);
            uVar41 = SUB84(dVar38,0);
            uVar42 = (undefined4)((ulong)dVar38 >> 0x20);
            if (dVar38 <= dVar33) {
              uVar41 = SUB84(dVar33,0);
              uVar42 = (undefined4)((ulong)dVar33 >> 0x20);
            }
            dVar45 = (double)CONCAT44(uVar42,uVar41);
            pdVar19 = (double *)plVar25[0x2f];
            dVar27 = cbrt(9.0);
            dVar28 = cbrt(0.3183098861837907);
            dVar48 = dVar27 * dVar27;
            dVar29 = 1.0 / (dVar28 * 0.3183098861837907);
            dVar38 = *pdVar19;
            dVar40 = (1.0 / dVar38) * 1.4422495703074083;
            dVar30 = cbrt(dVar45);
            dVar43 = dVar30 * dVar30;
            dVar20 = dVar40 * dVar43;
            dVar31 = tanh((dVar48 * dVar29 * dVar20) / 6.0);
            dVar32 = dVar28 * dVar28 * 0.10132118364233778;
            dVar33 = *pdVar19;
            dVar51 = dVar33 * dVar33;
            dVar53 = (1.0 / dVar30) / dVar45;
            dVar44 = dVar51 * 1.4422495703074083 * dVar53;
            dVar55 = dVar48 * dVar32 * dVar44;
            dVar49 = (1.0 / (dVar45 * dVar45)) * dVar33 * dVar51;
            dVar21 = dVar28 / 306.0196847852814;
            dVar57 = 1.0 / dVar43;
            dVar45 = dVar57 / (dVar45 * dVar45);
            dVar52 = dVar51 * dVar51 * 2.080083823051904;
            dVar56 = dVar45 * dVar52;
            dVar46 = dVar27 * dVar21 * dVar56;
            dVar50 = dVar28 * 0.3183098861837907 * dVar27;
            dVar33 = dVar33 * 2.080083823051904 * dVar50 * dVar57;
            if (dVar33 < 0.0) {
              dVar33 = sqrt(dVar33);
            }
            else {
              dVar33 = SQRT(dVar33);
            }
            dVar34 = tanh(2.121320343559643 / dVar33);
            dVar33 = pdVar19[3];
            dVar1 = pdVar19[4];
            dVar2 = pdVar19[2];
            dVar3 = pdVar19[5];
            dVar4 = pdVar19[6];
            __x = (1.0 / dVar30) * 2.519842099789747 * dVar28 * 1.4422495703074083;
            if (__x < 0.0) {
              dStack_248 = sqrt(__x);
            }
            else {
              dStack_248 = SQRT(__x);
            }
            dVar5 = pdVar19[0xd];
            dVar35 = exp((dVar20 * -pdVar19[0xe] * dVar48 * dVar29) / 6.0);
            dVar20 = pdVar19[0xc];
            dVar58 = pdVar19[0x1d];
            dVar59 = pdVar19[0x1e];
            dVar6 = pdVar19[0x1c];
            dVar7 = pdVar19[0x1f];
            dVar8 = pdVar19[0x20];
            dVar9 = pdVar19[0x13];
            dVar10 = pdVar19[0x14];
            dVar11 = pdVar19[0x12];
            dVar12 = pdVar19[0x15];
            dVar13 = pdVar19[0x16];
            dVar50 = dVar50 * *pdVar19;
            dVar57 = dVar57 * 2.080083823051904;
            dVar14 = (double)plVar25[0x31];
            dVar36 = exp(dVar50 * -0.2222222222222222 * dVar57 *
                         (dVar50 * 0.06361833333333333 * dVar57 * dStack_248 + 1.064009));
            dVar36 = 2.0 - dVar36 * (1.0 / (__x * 0.045802 + 1.0)) *
                                    (__x * -0.003481525 + 0.6666666666666666);
            dVar37 = pow((double)plVar25[0x31],dVar36);
            dVar36 = exp2(dVar36);
            dVar38 = tanh(((1.0 / dVar38) * dVar48 * dVar29 * 1.4422495703074083 * dVar43 *
                          1.5874010519681996) / 6.0);
            dVar47 = dVar53 * 1.4422495703074083 * dVar48 * dVar32 * dVar51 * 1.5874010519681996;
            dVar51 = dVar45 * 2.080083823051904 * dVar27 * dVar21 * dVar51 * dVar51 *
                     1.2599210498948732;
            dVar53 = dVar57 * dVar50 * 1.2599210498948732;
            if (dVar53 < 0.0) {
              dVar53 = sqrt(dVar53);
            }
            else {
              dVar53 = SQRT(dVar53);
            }
            dVar39 = tanh(3.0 / dVar53);
            dVar53 = pdVar19[8];
            dVar54 = dVar44 * 1.5874010519681996;
            dVar50 = pdVar19[9];
            dVar57 = pdVar19[7];
            dVar15 = pdVar19[10];
            dVar16 = pdVar19[0xb];
            dVar17 = pdVar19[0x10];
            dVar40 = exp((dVar43 * dVar40 * dVar29 * pdVar19[0x11] * dVar48 * 1.5874010519681996) /
                         -6.0);
            lVar22 = *plVar23;
            if ((lVar22 != 0) && ((*(byte *)(*plVar25 + 0x40) & 1) != 0)) {
              dVar59 = dVar59 * dVar27 * dVar21 * 0.19753086419753085 * dVar56 +
                       dVar58 * dVar48 * dVar32 * 0.14814814814814814 * dVar44 + dVar6;
              dVar28 = 1.0 / dVar28;
              dVar58 = 1.0 / (dVar8 * dVar27 * dVar21 * 0.19753086419753085 * dVar56 +
                             dVar7 * dVar48 * dVar32 * 0.14814814814814814 * dVar44 + 1.0);
              dVar29 = (double)(~-(ulong)(1.0 <= dVar14) & 0x3ff0000000000000 |
                               (ulong)dVar37 & -(ulong)(1.0 <= dVar14));
              dVar29 = (1.0 / (dVar36 + -2.0)) * (dVar29 + dVar29 + -2.0);
              dVar52 = dVar45 * 1.2599210498948732 * dVar52;
              dVar45 = pdVar19[0x23] * dVar27 * dVar21 * 0.024691358024691357 * dVar52 +
                       (pdVar19[0x22] * dVar48 * dVar32 * dVar54) / 27.0 + pdVar19[0x21];
              dVar43 = 1.0 / (pdVar19[0x25] * dVar27 * dVar21 * 0.024691358024691357 * dVar52 +
                             (pdVar19[0x24] * dVar48 * dVar32 * dVar54) / 27.0 + 1.0);
              lVar24 = (int)plVar25[0xb] * lVar26;
              *(double *)(lVar22 + lVar24 * 8) =
                   ((1.0 / (dVar45 * dVar38 * dVar43 * __x * 0.25 +
                           (1.0 / (dVar27 * pdVar19[0x1b] * dVar21 * 0.024691358024691357 * dVar52 +
                                  (dVar48 * pdVar19[0x1a] * dVar32 * dVar54) / 27.0 + 1.0)) *
                           dStack_248 *
                           (pdVar19[0x19] * dVar27 * dVar21 * 0.024691358024691357 * dVar52 +
                           (pdVar19[0x18] * dVar48 * dVar32 * dVar54) / 27.0 + pdVar19[0x17]) *
                           dVar39 * 0.5 + 1.0)) * dVar30 * dVar29 *
                   dVar28 * 1.5874010519681996 *
                   (dVar45 * dVar43 * (dVar17 * dVar40 + pdVar19[0xf]) * dVar38 * __x * 0.25 +
                   (1.0 / (dVar16 * dVar27 * dVar21 * 0.024691358024691357 * dVar52 +
                          (dVar15 * dVar48 * dVar32 * dVar54) / 27.0 + 1.0)) * dStack_248 *
                   (dVar50 * dVar27 * dVar21 * 0.024691358024691357 * dVar52 +
                   (dVar53 * dVar48 * dVar32 * dVar54) / 27.0 + dVar57) * dVar39 * 0.5 +
                   (1.0 / (dVar51 * 0.12618518518518518 + dVar47 * 0.30779666666666666 + 1.0)) *
                   dVar27 * 2.519842099789747 * 0.4010453259925992 * dVar28 * dVar38 *
                   (dVar51 * 0.042061728395061726 +
                   dVar49 * -0.00021049826280882748 + dVar47 * 0.11272703703703704 + 0.75) * 0.25) *
                   -2.080083823051904) / 3.0 +
                   ((dVar58 * dVar59 * (dVar35 * dVar5 + dVar20) * dVar31 * __x * 0.25 +
                    (1.0 / (dVar4 * dVar27 * dVar21 * 0.19753086419753085 * dVar56 +
                           dVar3 * dVar48 * dVar32 * 0.14814814814814814 * dVar44 + 1.0)) *
                    dStack_248 *
                    (dVar1 * dVar27 * dVar21 * 0.19753086419753085 * dVar56 +
                    dVar33 * dVar48 * dVar32 * 0.14814814814814814 * dVar44 + dVar2) * dVar34 * 0.5
                    + (1.0 / (dVar46 * 1.0094814814814814 + dVar55 * 1.2311866666666667 + 1.0)) *
                      dVar27 * 0.8020906519851985 * dVar28 * dVar31 *
                      (dVar46 * 0.3364938271604938 +
                      dVar49 * -0.0008419930512353099 + dVar55 * 0.45090814814814817 + 0.75) * 0.25)
                    * -2.080083823051904 * dVar28 *
                   dVar30 * 1.5874010519681996 *
                   (1.0 - dVar29) *
                   (1.0 / (dVar31 * dVar59 * dVar58 * __x * 0.25 +
                          (1.0 / (dVar13 * dVar27 * dVar21 * 0.19753086419753085 * dVar56 +
                                 dVar12 * dVar48 * dVar32 * 0.14814814814814814 * dVar44 + 1.0)) *
                          dStack_248 *
                          (dVar10 * dVar27 * dVar21 * 0.19753086419753085 * dVar56 +
                          dVar9 * dVar48 * dVar32 * 0.14814814814814814 * dVar44 + dVar11) * dVar34
                          * 0.5 + 1.0))) / 3.0 + *(double *)(lVar22 + lVar24 * 8);
            }
          }
          lVar26 = lVar26 + 1;
        } while (in_RSI != lVar26);
      }
      return;
    }
    __src = &par_ksdt;
  }
  memcpy(__dest,__src,0x130);
  return;
}

Assistant:

static void
lda_xc_ksdt_init(xc_func_type *p)
{
  lda_xc_ksdt_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(lda_xc_ksdt_params));
  params = (lda_xc_ksdt_params *)(p->params);

  switch(p->info->number){
  case XC_LDA_XC_KSDT:
    libxc_memcpy(params, &par_ksdt, sizeof(lda_xc_ksdt_params));
    break;
  case XC_LDA_XC_GDSMFB:
    libxc_memcpy(params, &par_gdsmfb, sizeof(lda_xc_ksdt_params));
    break;
  case XC_LDA_XC_CORRKSDT:
    libxc_memcpy(params, &par_corrksdt, sizeof(lda_xc_ksdt_params));
    break;
  default:
    fprintf(stderr, "Internal error in lda_xc_ksdt\n");
    exit(1);
  }
}